

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O0

string * __thiscall
anon_unknown.dwarf_8873c5::TransformActionStrip::operator()
          (string *__return_storage_ptr__,TransformActionStrip *this,string *s)

{
  TransformSelector *pTVar1;
  string_view str;
  uint uVar2;
  string *s_local;
  TransformActionStrip *this_local;
  
  pTVar1 = (this->super_TransformAction).Selector;
  uVar2 = (*(pTVar1->super_TransformSelector)._vptr_TransformSelector[4])(pTVar1,s);
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  }
  else {
    str = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)s);
    cmTrimWhitespace_abi_cxx11_(__return_storage_ptr__,str);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string operator()(const std::string& s) override
  {
    if (this->Selector->InSelection(s)) {
      return cmTrimWhitespace(s);
    }

    return s;
  }